

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O2

void __thiscall Cmd::editHistoryNext(Cmd *this,State *state,Direction dir)

{
  pointer pbVar1;
  size_t sVar2;
  ulong uVar3;
  
  pbVar1 = (this->history_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->history_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start == pbVar1) {
    return;
  }
  std::__cxx11::string::_M_assign((string *)(pbVar1 + ~state->history_index));
  sVar2 = state->history_index;
  if (dir == Next) {
    if (sVar2 == 0) {
      return;
    }
    state->history_index = sVar2 - 1;
  }
  else if (dir == Prev) {
    state->history_index = sVar2 + 1;
    uVar3 = (long)(this->history_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->history_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar3 <= sVar2 + 1) {
      state->history_index = uVar3 - 1;
      return;
    }
  }
  std::__cxx11::string::_M_assign((string *)state);
  state->pos = (state->buf)._M_string_length;
  refreshLine(this,state);
  return;
}

Assistant:

void editHistoryNext(State *state, Direction dir) {

		if (!history_.empty()) {
			// Update the current history entry before to overwrite it with the next one.
			history_[history_.size() - 1 - state->history_index] = state->buf;

			switch (dir) {
			case Direction::Prev:
				++state->history_index;
				if (state->history_index >= history_.size()) {
					state->history_index = history_.size() - 1;
					return;
				}
				break;
			case Direction::Next:
				if (state->history_index == 0) {
					return;
				}
				--state->history_index;
			}

			// Show the new entry
			state->buf = history_[history_.size() - 1 - state->history_index];
			state->pos = state->buf.size();
			refreshLine(state);
		}
	}